

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

bool __thiscall
irr::video::CNullDriver::setRenderTarget
          (CNullDriver *this,ITexture *texture,u16 clearFlag,SColor clearColor,f32 clearDepth,
          u8 clearStencil)

{
  dimension2d<unsigned_int> dVar1;
  pointer ppIVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  uint uVar5;
  undefined7 in_register_00000081;
  ulong uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  ITexture *local_58;
  string<char> local_50;
  IRenderTarget *this_00;
  
  uVar6 = CONCAT71(in_register_00000081,clearStencil);
  if (texture == (ITexture *)0x0) {
    iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x27])
                      (this,0,clearFlag,(ulong)clearColor.color,clearStencil);
    return SUB41(iVar3,0);
  }
  this_00 = this->SharedRenderTarget;
  if (this_00 == (IRenderTarget *)0x0) {
    iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x22])(this);
    this_00 = (IRenderTarget *)CONCAT44(extraout_var,iVar3);
    this->SharedRenderTarget = this_00;
  }
  ppIVar2 = (this->SharedDepthTextures).m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar4 = 0;
  do {
    if (((ulong)((long)(this->SharedDepthTextures).m_data.
                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3 & 0xffffffff
        ) == uVar4) {
      core::string<char>::string<char>(&local_50,"IRR_DEPTH_STENCIL");
      iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x14])
                        (this,&texture->Size,&local_50,0x10);
      local_58 = (ITexture *)CONCAT44(extraout_var_00,iVar3);
      ::std::__cxx11::string::_M_dispose();
      core::array<irr::video::ITexture_*>::push_back(&this->SharedDepthTextures,&local_58);
      this_00 = this->SharedRenderTarget;
      break;
    }
    local_58 = ppIVar2[uVar4];
    dVar1 = texture->Size;
    iVar3 = -(uint)(dVar1.Width == (local_58->Size).Width);
    iVar8 = -(uint)(dVar1.Height == (local_58->Size).Height);
    auVar7._4_4_ = iVar3;
    auVar7._0_4_ = iVar3;
    auVar7._8_4_ = iVar8;
    auVar7._12_4_ = iVar8;
    uVar5 = movmskpd((int)uVar6,auVar7);
    uVar6 = (ulong)uVar5;
    uVar4 = uVar4 + 1;
  } while (uVar5 != 3);
  IRenderTarget::setTexture(this_00,texture,local_58);
  iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x27])
                    (this,this->SharedRenderTarget,clearFlag,(ulong)clearColor.color,clearStencil);
  return SUB41(iVar3,0);
}

Assistant:

bool CNullDriver::setRenderTarget(ITexture *texture, u16 clearFlag, SColor clearColor, f32 clearDepth, u8 clearStencil)
{
	if (texture) {
		// create render target if require.
		if (!SharedRenderTarget)
			SharedRenderTarget = addRenderTarget();

		ITexture *depthTexture = 0;

		// try to find available depth texture with require size.
		for (u32 i = 0; i < SharedDepthTextures.size(); ++i) {
			if (SharedDepthTextures[i]->getSize() == texture->getSize()) {
				depthTexture = SharedDepthTextures[i];

				break;
			}
		}

		// create depth texture if require.
		if (!depthTexture) {
			depthTexture = addRenderTargetTexture(texture->getSize(), "IRR_DEPTH_STENCIL", video::ECF_D24S8);
			SharedDepthTextures.push_back(depthTexture);
		}

		SharedRenderTarget->setTexture(texture, depthTexture);

		return setRenderTargetEx(SharedRenderTarget, clearFlag, clearColor, clearDepth, clearStencil);
	} else {
		return setRenderTargetEx(0, clearFlag, clearColor, clearDepth, clearStencil);
	}
}